

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool SetPropertyCommand::HandleAndValidateSourceFilePropertyGENERATED
               (cmSourceFile *sf,string *propertyValue,PropertyOp op)

{
  cmMakefile *pcVar1;
  string *this;
  bool bVar2;
  cmSourceFileLocation *this_00;
  PolicyID id;
  PolicyID id_00;
  PolicyID extraout_EDX;
  PolicyID id_01;
  byte local_3f2;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  string_view local_308;
  cmAlphaNum local_2f8;
  cmAlphaNum local_2c8;
  string local_298;
  string_view local_278;
  string_view local_268;
  cmAlphaNum local_258;
  string local_228;
  cmAlphaNum local_208;
  string local_1d8;
  cmAlphaNum local_1b8;
  string local_188;
  cmAlphaNum local_168;
  string local_138;
  string_view local_118;
  cmAlphaNum local_108;
  string local_c8;
  cmAlphaNum local_a8;
  string local_78;
  string_view local_58;
  string_view local_48;
  byte local_36;
  undefined1 local_35;
  PolicyStatus local_34;
  bool policyNEW;
  bool policyWARN;
  cmMakefile *pcStack_30;
  PolicyStatus policyStatus;
  cmMakefile *mf;
  string *psStack_20;
  PropertyOp op_local;
  string *propertyValue_local;
  cmSourceFile *sf_local;
  
  mf._4_4_ = op;
  psStack_20 = propertyValue;
  propertyValue_local = (string *)sf;
  this_00 = cmSourceFile::GetLocation(sf);
  pcStack_30 = cmSourceFileLocation::GetMakefile(this_00);
  local_34 = cmMakefile::GetPolicyStatus(pcStack_30,CMP0118,false);
  local_35 = local_34 == WARN;
  local_3f2 = 0;
  if (local_34 != OLD) {
    local_3f2 = local_35 ^ 0xff;
  }
  local_36 = local_3f2 & 1;
  if ((bool)local_35) {
    local_48 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_20);
    bVar2 = cmIsOn(local_48);
    if (!bVar2) {
      local_58 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_20);
      bVar2 = cmIsOff(local_58);
      pcVar1 = pcStack_30;
      if (!bVar2) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_c8,(cmPolicies *)0x76,id);
        cmAlphaNum::cmAlphaNum(&local_a8,&local_c8);
        cmAlphaNum::cmAlphaNum
                  (&local_108,
                   "\nAttempt to set property \'GENERATED\' with the following non-boolean value (which will be interpreted as \"0\"):\n"
                  );
        cmStrCat<std::__cxx11::string,char[129]>
                  (&local_78,&local_a8,&local_108,psStack_20,
                   (char (*) [129])
                   "\nThat exact value will not be retrievable. A value of \"0\" will be returned instead.\nThis will be an error under policy CMP0118.\n"
                  );
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_c8);
      }
    }
    local_118 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_20);
    bVar2 = cmIsOff(local_118);
    pcVar1 = pcStack_30;
    id_01 = id_00;
    if (bVar2) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_188,(cmPolicies *)0x76,id_00);
      cmAlphaNum::cmAlphaNum(&local_168,&local_188);
      cmAlphaNum::cmAlphaNum
                (&local_1b8,
                 "\nUnsetting property \'GENERATED\' will not be allowed under policy CMP0118!\n");
      cmStrCat<>(&local_138,&local_168,&local_1b8);
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_188);
      id_01 = extraout_EDX;
    }
    pcVar1 = pcStack_30;
    if ((mf._4_4_ == Append) || (mf._4_4_ == AppendAsString)) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_228,(cmPolicies *)0x76,id_01);
      cmAlphaNum::cmAlphaNum(&local_208,&local_228);
      cmAlphaNum::cmAlphaNum
                (&local_258,
                 "\nAppending to property \'GENERATED\' will not be allowed under policy CMP0118!\n"
                );
      cmStrCat<>(&local_1d8,&local_208,&local_258);
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_228);
    }
  }
  else if (local_36 != 0) {
    local_268 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_20);
    bVar2 = cmIsOn(local_268);
    if (!bVar2) {
      local_278 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_20);
      bVar2 = cmIsOff(local_278);
      pcVar1 = pcStack_30;
      if (!bVar2) {
        cmAlphaNum::cmAlphaNum
                  (&local_2c8,
                   "Policy CMP0118 is set to NEW and the following non-boolean value given for property \'GENERATED\' is therefore not allowed:\n"
                  );
        cmAlphaNum::cmAlphaNum(&local_2f8,psStack_20);
        cmStrCat<char[35]>(&local_298,&local_2c8,&local_2f8,
                           (char (*) [35])"\nReplace it with a boolean value!\n");
        cmMakefile::IssueMessage(pcVar1,AUTHOR_ERROR,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        return true;
      }
    }
    local_308 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_20);
    bVar2 = cmIsOff(local_308);
    pcVar1 = pcStack_30;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,
                 "Unsetting the \'GENERATED\' property is not allowed under CMP0118!\n",&local_329);
      cmMakefile::IssueMessage(pcVar1,AUTHOR_ERROR,&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator(&local_329);
      return true;
    }
    if ((mf._4_4_ == Append) || (mf._4_4_ == AppendAsString)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,
                 "Policy CMP0118 is set to NEW and appending to the \'GENERATED\' property is therefore not allowed. Only setting it to \"1\" is allowed!\n"
                 ,&local_351);
      cmMakefile::IssueMessage(pcVar1,AUTHOR_ERROR,&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator(&local_351);
      return true;
    }
  }
  this = propertyValue_local;
  if ((local_36 & 1) == 0) {
    switch(mf._4_4_) {
    case Remove:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c8,"GENERATED",&local_3c9);
      cmSourceFile::SetProperty((cmSourceFile *)this,&local_3c8,(char *)0x0);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::allocator<char>::~allocator(&local_3c9);
      break;
    case Set:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f0,"GENERATED",&local_3f1);
      cmSourceFile::SetProperty((cmSourceFile *)this,&local_3f0,psStack_20);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator(&local_3f1);
      break;
    case Append:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,"GENERATED",&local_379);
      cmSourceFile::AppendProperty((cmSourceFile *)this,&local_378,psStack_20,false);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator(&local_379);
      break;
    case AppendAsString:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a0,"GENERATED",&local_3a1);
      cmSourceFile::AppendProperty((cmSourceFile *)this,&local_3a0,psStack_20,true);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::allocator<char>::~allocator(&local_3a1);
    }
  }
  else {
    cmSourceFile::MarkAsGenerated((cmSourceFile *)propertyValue_local);
  }
  return true;
}

Assistant:

bool HandleAndValidateSourceFilePropertyGENERATED(
  cmSourceFile* sf, std::string const& propertyValue, PropertyOp op)
{
  const auto& mf = *sf->GetLocation().GetMakefile();
  auto policyStatus = mf.GetPolicyStatus(cmPolicies::CMP0118);

  const bool policyWARN = policyStatus == cmPolicies::WARN;
  const bool policyNEW = policyStatus != cmPolicies::OLD && !policyWARN;

  if (policyWARN) {
    if (!cmIsOn(propertyValue) && !cmIsOff(propertyValue)) {
      mf.IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0118),
                 "\nAttempt to set property 'GENERATED' with the following "
                 "non-boolean value (which will be interpreted as \"0\"):\n",
                 propertyValue,
                 "\nThat exact value will not be retrievable. A value of "
                 "\"0\" will be returned instead.\n"
                 "This will be an error under policy CMP0118.\n"));
    }
    if (cmIsOff(propertyValue)) {
      mf.IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0118),
                 "\nUnsetting property 'GENERATED' will not be allowed under "
                 "policy CMP0118!\n"));
    }
    if (op == PropertyOp::Append || op == PropertyOp::AppendAsString) {
      mf.IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0118),
                 "\nAppending to property 'GENERATED' will not be allowed "
                 "under policy CMP0118!\n"));
    }
  } else if (policyNEW) {
    if (!cmIsOn(propertyValue) && !cmIsOff(propertyValue)) {
      mf.IssueMessage(
        MessageType::AUTHOR_ERROR,
        cmStrCat(
          "Policy CMP0118 is set to NEW and the following non-boolean value "
          "given for property 'GENERATED' is therefore not allowed:\n",
          propertyValue, "\nReplace it with a boolean value!\n"));
      return true;
    }
    if (cmIsOff(propertyValue)) {
      mf.IssueMessage(
        MessageType::AUTHOR_ERROR,
        "Unsetting the 'GENERATED' property is not allowed under CMP0118!\n");
      return true;
    }
    if (op == PropertyOp::Append || op == PropertyOp::AppendAsString) {
      mf.IssueMessage(MessageType::AUTHOR_ERROR,
                      "Policy CMP0118 is set to NEW and appending to the "
                      "'GENERATED' property is therefore not allowed. Only "
                      "setting it to \"1\" is allowed!\n");
      return true;
    }
  }

  // Set property.
  if (!policyNEW) {
    // Do it the traditional way.
    switch (op) {
      case PropertyOp::Append:
        sf->AppendProperty("GENERATED", propertyValue, false);
        break;
      case PropertyOp::AppendAsString:
        sf->AppendProperty("GENERATED", propertyValue, true);
        break;
      case PropertyOp::Remove:
        sf->SetProperty("GENERATED", nullptr);
        break;
      case PropertyOp::Set:
        sf->SetProperty("GENERATED", propertyValue);
        break;
    }
  } else {
    sf->MarkAsGenerated();
  }
  return true;
}